

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::AddOpHelperSpilled(LinearScan *this,Lifetime *lifetime)

{
  RegNum RVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  int iVar5;
  undefined4 *puVar6;
  RegNum reg;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  RVar1 = lifetime->reg;
  bVar3 = IsInHelperBlock(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2c7,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar4 = BVUnitT<unsigned_long>::Test(&this->opHelperSpilledRegs,(uint)RVar1);
  if (BVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2c8,"(!this->opHelperSpilledRegs.Test(reg))",
                       "!this->opHelperSpilledRegs.Test(reg)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((*(ushort *)&lifetime->field_0x9c >> 4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2c9,"(lifetime->isOpHelperSpilled == false)",
                       "lifetime->isOpHelperSpilled == false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((*(ushort *)&lifetime->field_0x9c >> 6 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2ca,"(lifetime->cantOpHelperSpill == false)",
                       "lifetime->cantOpHelperSpill == false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVUnitT<unsigned_long>::Set(&this->opHelperSpilledRegs,(uint)RVar1);
  *(ushort *)&lifetime->field_0x9c = *(ushort *)&lifetime->field_0x9c & 0xffef | 0x10;
  this->regContent[RVar1] = (Lifetime *)0x0;
  BVUnitT<unsigned_long>::Clear(&this->secondChanceRegs,(uint)RVar1);
  iVar5 = JsUtil::
          BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&this->currentBlock->inlineeFrameSyms);
  if (((0 < iVar5) &&
      (bVar3 = JsUtil::
               BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::ContainsKey(&this->currentBlock->inlineeFrameSyms,&(lifetime->sym->super_Sym).m_id)
      , bVar3)) &&
     (((*(uint *)&lifetime->sym->field_0x18 & 1) != 0 ||
      (bVar3 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                         (&(lifetime->defList).
                           super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>), !bVar3)
      ))) {
    *(ushort *)&lifetime->field_0x9c = *(ushort *)&lifetime->field_0x9c & 0xffdf | 0x20;
    bVar3 = StackSym::IsAllocated(lifetime->sym);
    if (!bVar3) {
      AllocateStackSpace(this,lifetime);
    }
    RecordLoopUse(this,lifetime,lifetime->reg);
  }
  AddLiveRange(this->opHelperSpilledLiveranges,lifetime);
  return;
}

Assistant:

void
LinearScan::AddOpHelperSpilled(Lifetime * lifetime)
{
    RegNum reg = lifetime->reg;
    Assert(this->IsInHelperBlock());
    Assert(!this->opHelperSpilledRegs.Test(reg));
    Assert(lifetime->isOpHelperSpilled == false);
    Assert(lifetime->cantOpHelperSpill == false);


    this->opHelperSpilledRegs.Set(reg);
    lifetime->isOpHelperSpilled = true;

    this->regContent[reg] = nullptr;
    this->secondChanceRegs.Clear(reg);

    // If a lifetime is being OpHelper spilled and it's an inlinee arg sym
    // we need to make sure its spilled to the sym offset spill space, i.e. isOpHelperSpillAsArg
    // is set. Otherwise, it's value will not be available on inline frame reconstruction.
    if (this->currentBlock->inlineeFrameSyms.Count() > 0 &&
        this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id) &&
        (lifetime->sym->m_isSingleDef || !lifetime->defList.Empty()))
    {
        lifetime->isOpHelperSpillAsArg = true;
        if (!lifetime->sym->IsAllocated())
        {
            this->AllocateStackSpace(lifetime);
        }
        this->RecordLoopUse(lifetime, lifetime->reg);
    }
    LinearScan::AddLiveRange(this->opHelperSpilledLiveranges, lifetime);
}